

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_string.cpp
# Opt level: O3

bool __thiscall Am_String::operator==(Am_String *this,char *test_string)

{
  Am_String_Data *this_00;
  int iVar1;
  char *__s1;
  bool bVar2;
  
  this_00 = this->data;
  bVar2 = test_string == (char *)0x0 && this_00 == (Am_String_Data *)0x0;
  if (this_00 != (Am_String_Data *)0x0 && test_string != (char *)0x0) {
    __s1 = Am_String_Data::operator_cast_to_char_(this_00);
    if (__s1 == test_string) {
      bVar2 = true;
    }
    else {
      iVar1 = strcmp(__s1,test_string);
      bVar2 = iVar1 == 0;
    }
  }
  return bVar2;
}

Assistant:

bool
Am_String::operator==(const char *test_string) const
{
  if (test_string) {
    if (data) {
      const char *string = *data;
      return (string == test_string) || !strcmp(string, test_string);
    } else
      return test_string == nullptr;
  } else
    return data == nullptr;
}